

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O1

bool xercesc_4_0::XMLURL::parse(XMLCh *urlText,XMLURL *xmlURL)

{
  short *psVar1;
  MemoryManager *pMVar2;
  bool bVar3;
  int iVar4;
  Protocols PVar5;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  undefined4 extraout_var_01;
  XMLCh *__dest;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 *__dest_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  ArrayJanitor<char16_t> janSrcCopy;
  ArrayJanitor<char16_t> local_40;
  char16_t *toDelete;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_05;
  
  if (*urlText == L'\0') {
    return false;
  }
  bVar3 = XMLUri::isURIString(urlText);
  xmlURL->fHasInvalidChar = !bVar3;
  if (((ushort)((*urlText & 0xffdfU) - 0x41U) < 0x1a) && (urlText[1] == L':')) {
    if (urlText[2] == L'/') {
      return false;
    }
    if (urlText[2] == L'\\') {
      return false;
    }
  }
  sVar10 = 0;
  do {
    psVar1 = (short *)((long)urlText + sVar10);
    sVar10 = sVar10 + 2;
  } while (*psVar1 != 0);
  iVar4 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])(xmlURL->fMemoryManager,sVar10);
  toDelete = (char16_t *)CONCAT44(extraout_var,iVar4);
  memcpy(toDelete,urlText,sVar10);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,xmlURL->fMemoryManager);
  uVar9 = (ulong)(ushort)*toDelete;
  bVar3 = uVar9 == 0;
  if (!bVar3) {
    while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar9] < '\0') {
      uVar9 = (ulong)(ushort)toDelete[1];
      bVar3 = uVar9 == 0;
      if (bVar3) goto LAB_0025f914;
      toDelete = toDelete + 1;
    }
    if (!bVar3) {
      pXVar6 = XMLString::findAny(toDelete,L":/");
      if ((pXVar6 != (XMLCh *)0x0) && (*pXVar6 == L':')) {
        *pXVar6 = L'\0';
        lVar11 = 8;
        do {
          iVar4 = XMLString::compareIStringASCII(toDelete,*(XMLCh **)((long)&gProtoList + lVar11));
          if (iVar4 == 0) {
            PVar5 = *(Protocols *)(&UNK_0040d418 + lVar11);
            goto LAB_0025f6c4;
          }
          lVar11 = lVar11 + 0x18;
        } while (lVar11 != 0x68);
        PVar5 = Unknown;
LAB_0025f6c4:
        xmlURL->fProtocol = PVar5;
        if (PVar5 == Unknown) goto LAB_0025f914;
        toDelete = pXVar6 + 1;
      }
      if ((*toDelete == L'/') && (toDelete[1] == L'/')) {
        pXVar6 = toDelete + 2;
        if (toDelete[2] != L'\0') {
          pXVar7 = XMLString::findAny(pXVar6,L"/");
          if (pXVar7 == (XMLCh *)0x0) {
            sVar10 = 0;
            do {
              psVar1 = (short *)((long)pXVar6 + sVar10);
              sVar10 = sVar10 + 2;
            } while (*psVar1 != 0);
            iVar4 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])(xmlURL->fMemoryManager,sVar10)
            ;
            pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
            memcpy(pXVar7,pXVar6,sVar10);
            xmlURL->fHost = pXVar7;
            lVar11 = 0;
            if (pXVar7 != (XMLCh *)0x0) {
              do {
                psVar1 = (short *)((long)pXVar7 + lVar11);
                lVar11 = lVar11 + 2;
              } while (*psVar1 != 0);
              lVar11 = (lVar11 >> 1) + -1;
            }
            pXVar6 = pXVar6 + lVar11;
          }
          else if ((long)pXVar7 - (long)pXVar6 != 0) {
            iVar4 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])
                              (xmlURL->fMemoryManager,((long)pXVar7 - (long)pXVar6) + 2);
            pXVar8 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
            xmlURL->fHost = pXVar8;
            for (; pXVar6 < pXVar7; pXVar6 = pXVar6 + 1) {
              *pXVar8 = *pXVar6;
              pXVar8 = pXVar8 + 1;
            }
            *pXVar8 = L'\0';
          }
        }
      }
      else {
        pXVar6 = toDelete;
        if (xmlURL->fProtocol == HTTP) goto LAB_0025f914;
      }
      if (xmlURL->fHost != (XMLCh *)0x0) {
        pXVar7 = XMLString::findAny(xmlURL->fHost,L"@");
        if (pXVar7 != (XMLCh *)0x0) {
          *pXVar7 = L'\0';
          pXVar8 = xmlURL->fHost;
          if (pXVar8 == (XMLCh *)0x0) {
            __dest = (XMLCh *)0x0;
          }
          else {
            sVar10 = 0;
            do {
              psVar1 = (short *)((long)pXVar8 + sVar10);
              sVar10 = sVar10 + 2;
            } while (*psVar1 != 0);
            iVar4 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])(xmlURL->fMemoryManager,sVar10)
            ;
            __dest = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
            memcpy(__dest,pXVar8,sVar10);
          }
          xmlURL->fUser = __dest;
          XMLString::cut(xmlURL->fHost,(long)pXVar7 + (2 - (long)xmlURL->fHost) >> 1);
          pXVar7 = XMLString::findAny(xmlURL->fUser,L":");
          if (pXVar7 != (XMLCh *)0x0) {
            *pXVar7 = L'\0';
            sVar10 = 0;
            do {
              psVar1 = (short *)((long)(pXVar7 + 1) + sVar10);
              sVar10 = sVar10 + 2;
            } while (*psVar1 != 0);
            iVar4 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])(xmlURL->fMemoryManager,sVar10)
            ;
            memcpy((XMLCh *)CONCAT44(extraout_var_03,iVar4),pXVar7 + 1,sVar10);
            xmlURL->fPassword = (XMLCh *)CONCAT44(extraout_var_03,iVar4);
          }
        }
        pXVar7 = XMLString::findAny(xmlURL->fHost,L":");
        if (pXVar7 != (XMLCh *)0x0) {
          *pXVar7 = L'\0';
          bVar3 = XMLString::textToBin(pXVar7 + 1,&xmlURL->fPortNum,xmlURL->fMemoryManager);
          if (!bVar3) goto LAB_0025f914;
        }
        if (*xmlURL->fHost == L'\0') {
          (*xmlURL->fMemoryManager->_vptr_MemoryManager[4])();
          xmlURL->fHost = (XMLCh *)0x0;
        }
      }
      if (*pXVar6 == L'\0') {
        if (xmlURL->fHost != (XMLCh *)0x0) {
          iVar4 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])(xmlURL->fMemoryManager,4);
          __dest_00 = (undefined4 *)CONCAT44(extraout_var_05,iVar4);
          *__dest_00 = 0x2f;
          goto LAB_0025f983;
        }
      }
      else {
        pXVar7 = XMLString::findAny(pXVar6,L"#?");
        if (pXVar7 == (XMLCh *)0x0) {
          sVar10 = 0;
          do {
            psVar1 = (short *)((long)pXVar6 + sVar10);
            sVar10 = sVar10 + 2;
          } while (*psVar1 != 0);
          iVar4 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])(xmlURL->fMemoryManager,sVar10);
          __dest_00 = (undefined4 *)CONCAT44(extraout_var_06,iVar4);
          memcpy(__dest_00,pXVar6,sVar10);
LAB_0025f983:
          lVar11 = 0x28;
        }
        else {
          if (pXVar6 <= pXVar7 && (long)pXVar7 - (long)pXVar6 != 0) {
            iVar4 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])
                              (xmlURL->fMemoryManager,((long)pXVar7 - (long)pXVar6) + 2);
            pXVar8 = (XMLCh *)CONCAT44(extraout_var_04,iVar4);
            xmlURL->fPath = pXVar8;
            for (; pXVar6 < pXVar7; pXVar6 = pXVar6 + 1) {
              *pXVar8 = *pXVar6;
              pXVar8 = pXVar8 + 1;
            }
            *pXVar8 = L'\0';
          }
          pXVar7 = pXVar6 + 1;
          if (*pXVar6 == L'#') {
            sVar10 = 0;
            do {
              psVar1 = (short *)((long)pXVar7 + sVar10);
              sVar10 = sVar10 + 2;
            } while (*psVar1 != 0);
            iVar4 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])(xmlURL->fMemoryManager,sVar10)
            ;
            __dest_00 = (undefined4 *)CONCAT44(extraout_var_07,iVar4);
          }
          else {
            pXVar6 = XMLString::findAny(pXVar7,L"#");
            pMVar2 = xmlURL->fMemoryManager;
            if (pXVar6 == (XMLCh *)0x0) {
              sVar10 = 0;
              do {
                psVar1 = (short *)((long)pXVar7 + sVar10);
                sVar10 = sVar10 + 2;
              } while (*psVar1 != 0);
              iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,sVar10);
              __dest_00 = (undefined4 *)CONCAT44(extraout_var_10,iVar4);
              memcpy(__dest_00,pXVar7,sVar10);
              lVar11 = 0x38;
              goto LAB_0025fa79;
            }
            iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,(long)pXVar6 + (2 - (long)pXVar7));
            pXVar8 = (XMLCh *)CONCAT44(extraout_var_08,iVar4);
            xmlURL->fQuery = pXVar8;
            for (; pXVar7 < pXVar6; pXVar7 = pXVar7 + 1) {
              *pXVar8 = *pXVar7;
              pXVar8 = pXVar8 + 1;
            }
            *pXVar8 = L'\0';
            bVar3 = true;
            if (*pXVar7 != L'#') goto LAB_0025f916;
            pXVar7 = pXVar7 + 1;
            sVar10 = 0;
            do {
              psVar1 = (short *)((long)pXVar7 + sVar10);
              sVar10 = sVar10 + 2;
            } while (*psVar1 != 0);
            iVar4 = (*xmlURL->fMemoryManager->_vptr_MemoryManager[3])(xmlURL->fMemoryManager,sVar10)
            ;
            __dest_00 = (undefined4 *)CONCAT44(extraout_var_09,iVar4);
          }
          memcpy(__dest_00,pXVar7,sVar10);
          lVar11 = 0x10;
        }
LAB_0025fa79:
        *(undefined4 **)((long)&xmlURL->_vptr_XMLURL + lVar11) = __dest_00;
      }
      bVar3 = true;
      goto LAB_0025f916;
    }
  }
LAB_0025f914:
  bVar3 = false;
LAB_0025f916:
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return bVar3;
}

Assistant:

bool XMLURL::parse(const XMLCh* const urlText, XMLURL& xmlURL)
{
    // Simplify things by checking for the psycho scenarios first
    if (!*urlText)
        return false;

    // Before we start, check if this urlText contains valid uri characters
    if (!XMLUri::isURIString(urlText))
        xmlURL.fHasInvalidChar = true;
    else
        xmlURL.fHasInvalidChar = false;

    //
    //  The first thing we will do is to check for a file name, so that
    //  we don't waste time thinking its a URL. If its in the form x:\ or x:/
    //  and x is an ASCII letter, then assume that's the deal.
    //
    if (((*urlText >= chLatin_A) && (*urlText <= chLatin_Z))
    ||  ((*urlText >= chLatin_a) && (*urlText <= chLatin_z)))
    {
        if (*(urlText + 1) == chColon)
        {
            if ((*(urlText + 2) == chForwardSlash)
            ||  (*(urlText + 2) == chBackSlash))
            {
                return false;
            }
        }
    }

    // Get a copy of the URL that we can modify
    XMLCh* srcCpy = XMLString::replicate(urlText, xmlURL.fMemoryManager);
    ArrayJanitor<XMLCh> janSrcCopy(srcCpy, xmlURL.fMemoryManager);

    //
    //  Get a pointer now that we can run up thrown the source as we parse
    //  bits and pieces out of it.
    //
    XMLCh* srcPtr = srcCpy;

    // Run up past any spaces
    while (*srcPtr)
    {
        if (!XMLChar1_0::isWhitespace(*srcPtr))
            break;
        srcPtr++;
    }

    // Make sure it wasn't all space
    if (!*srcPtr)
        return false;

    //
    //  Ok, the next thing we have to do is to find either a / or : character.
    //  If the : is first, we assume we have a protocol. If the / is first,
    //  then we skip to the host processing.
    //
    XMLCh* ptr1 = XMLString::findAny(srcPtr, gListOne);
    XMLCh* ptr2;

    // If we found a protocol, then deal with it
    if (ptr1)
    {
        if (*ptr1 == chColon)
        {
            // Cap the string at the colon
            *ptr1 = 0;

            // And try to find it in our list of protocols
            xmlURL.fProtocol = lookupByName(srcPtr);

            if (xmlURL.fProtocol == Unknown)
                return false;

            // And move our source pointer up past what we've processed
            srcPtr = (ptr1 + 1);
        }
    }

    //
    //  Ok, next we need to see if we have any host part. If the next
    //  two characters are //, then we need to check, else move on.
    //
    if ((*srcPtr == chForwardSlash) && (*(srcPtr + 1) == chForwardSlash))
    {
        // Move up past the slashes
        srcPtr += 2;

        //
        //  If we aren't at the end of the string, then there has to be a
        //  host part at this point. we will just look for the next / char
        //  or end of string and make all of that the host for now.
        //
        if (*srcPtr)
        {
            // Search from here for a / character
            ptr1 = XMLString::findAny(srcPtr, gListFour);

            //
            //  If we found something, then the host is between where
            //  we are and what we found. Else the host is the rest of
            //  the content and we are done. If its empty, leave it null.
            //
            if (ptr1)
            {
                if (ptr1 != srcPtr)
                {
                    xmlURL.fHost = (XMLCh*) xmlURL.fMemoryManager->allocate
                    (
                        ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
                    );//new XMLCh[(ptr1 - srcPtr) + 1];
                    ptr2 = xmlURL.fHost;
                    while (srcPtr < ptr1)
                        *ptr2++ = *srcPtr++;
                    *ptr2 = 0;
                }
            }
             else
            {
                xmlURL.fHost = XMLString::replicate(srcPtr, xmlURL.fMemoryManager);

                // Update source pointer to the end
                srcPtr += XMLString::stringLen(xmlURL.fHost);
            }
        }
    }
    else
    {
        //
        // http protocol requires two forward slashes
        // we didn't get them, so throw an exception
        //
        if (xmlURL.fProtocol == HTTP)
            return false;
    }

    //
    //  If there was a host part, then we have to grovel through it for
    //  all the bits and pieces it can hold.
    //
    if (xmlURL.fHost)
    {
        //
        //  Look for a '@' character, which indicates a user name. If we
        //  find one, then everything between the start of the host data
        //  and the character is the user name.
        //
        ptr1 = XMLString::findAny(xmlURL.fHost, gListTwo);
        if (ptr1)
        {
            // Get this info out as the user name
            *ptr1 = 0;
            xmlURL.fUser = XMLString::replicate(xmlURL.fHost, xmlURL.fMemoryManager);
            ptr1++;

            // And now cut these chars from the host string
            XMLString::cut(xmlURL.fHost, ptr1 - xmlURL.fHost);

            // Is there a password inside the user string?
            ptr2 = XMLString::findAny(xmlURL.fUser, gListThree);
            if (ptr2)
            {
                // Remove it from the user name string
                *ptr2 = 0;

                // And copy out the remainder to the password field
                ptr2++;
                xmlURL.fPassword = XMLString::replicate(ptr2, xmlURL.fMemoryManager);
            }
        }

        //
        //  Ok, so now we are at the actual host name, if any. If we are
        //  not at the end of the host data, then lets see if we have a
        //  port trailing the
        //
        ptr1 = XMLString::findAny(xmlURL.fHost, gListThree);
        if (ptr1)
        {
            // Remove it from the host name
            *ptr1 = 0;

            // Try to convert it to a numeric port value and store it
            ptr1++;
            if (!XMLString::textToBin(ptr1, xmlURL.fPortNum, xmlURL.fMemoryManager))
                return false;
        }

        // If the host ended up empty, then toss is
        if (!*(xmlURL.fHost))
        {
            xmlURL.fMemoryManager->deallocate(xmlURL.fHost);//delete[] fHost;
            xmlURL.fHost = 0;
        }
    }

    // If we are at the end, then we are done now
    if (!*srcPtr) {
        if(xmlURL.fHost) {
            static const XMLCh slash[] = { chForwardSlash, chNull };
            xmlURL.fPath = XMLString::replicate(slash, xmlURL.fMemoryManager);
        }
        return true;
    }

    //
    //  Next is the path part. It can be absolute, i.e. starting with a
    //  forward slash character, or relative. Its basically everything up
    //  to the end of the string or to any trailing query or fragment.
    //
    ptr1 = XMLString::findAny(srcPtr, gListFive);
    if (!ptr1)
    {
        xmlURL.fPath = XMLString::replicate(srcPtr, xmlURL.fMemoryManager);
        return true;
    }

    // Everything from where we are to what we found is the path
    if (ptr1 > srcPtr)
    {
        xmlURL.fPath = (XMLCh*) xmlURL.fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = xmlURL.fPath;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    //
    //  If we found a fragment, then it is the rest of the string and we
    //  are done.
    //
    if (*srcPtr == chPound)
    {
        srcPtr++;
        xmlURL.fFragment = XMLString::replicate(srcPtr, xmlURL.fMemoryManager);
        return true;
    }

    //
    //  The query is either the rest of the string, or up to the fragment
    //  separator.
    //
    srcPtr++;
    ptr1 = XMLString::findAny(srcPtr, gListSix);
    if (!ptr1)
    {
        xmlURL.fQuery = XMLString::replicate(srcPtr, xmlURL.fMemoryManager);
        return true;
    }
     else
    {
        xmlURL.fQuery = (XMLCh*) xmlURL.fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = xmlURL.fQuery;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    // If we are not at the end now, then everything else is the fragment
    if (*srcPtr == chPound)
    {
        srcPtr++;
        xmlURL.fFragment = XMLString::replicate(srcPtr, xmlURL.fMemoryManager);
    }

    return true;
}